

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

uint32_t icu_63::CollationFastLatin::lookupUTF8Unsafe
                   (uint16_t *table,UChar32 c,uint8_t *s8,int32_t *sIndex)

{
  byte bVar1;
  int iVar2;
  uint8_t t2;
  int32_t *sIndex_local;
  uint8_t *s8_local;
  UChar32 c_local;
  uint16_t *table_local;
  
  if (c < 0xc6) {
    iVar2 = *sIndex;
    *sIndex = iVar2 + 1;
    table_local._4_4_ = (uint)table[(int)((c + -0xc2) * 0x40 + (uint)s8[iVar2])];
  }
  else {
    bVar1 = s8[*sIndex + 1];
    *sIndex = *sIndex + 2;
    if (c == 0xe2) {
      table_local._4_4_ = (uint)table[(int)(bVar1 + 0x100)];
    }
    else if (bVar1 == 0xbe) {
      table_local._4_4_ = 3;
    }
    else {
      table_local._4_4_ = 0xfca8;
    }
  }
  return table_local._4_4_;
}

Assistant:

uint32_t
CollationFastLatin::lookupUTF8Unsafe(const uint16_t *table, UChar32 c,
                                     const uint8_t *s8, int32_t &sIndex) {
    // The caller handled ASCII.
    // The string is well-formed and contains only supported characters.
    U_ASSERT(c > 0x7f);
    if(c <= LATIN_MAX_UTF8_LEAD) {
        return table[((c - 0xc2) << 6) + s8[sIndex++]];  // 0080..017F
    }
    uint8_t t2 = s8[sIndex + 1];
    sIndex += 2;
    if(c == 0xe2) {
        return table[(LATIN_LIMIT - 0x80) + t2];  // 2000..203F -> 0180..01BF
    } else if(t2 == 0xbe) {
        return MERGE_WEIGHT;  // U+FFFE
    } else {
        return MAX_SHORT | COMMON_SEC | LOWER_CASE | COMMON_TER;  // U+FFFF
    }
}